

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModSqrt_test.cpp
# Opt level: O0

void __thiscall MOD_SQRT_SmallValues_Test::TestBody(MOD_SQRT_SmallValues_Test *this)

{
  bool bVar1;
  int extraout_EAX;
  reference piVar2;
  reference piVar3;
  char *message;
  double __x;
  AssertHelper local_f0;
  Message local_e8;
  int local_e0;
  int local_dc;
  undefined1 local_d8 [8];
  AssertionResult gtest_ar;
  int s;
  int a_1;
  iterator __end2;
  iterator __begin2;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *__range2;
  int local_88;
  int local_84;
  undefined1 local_80 [4];
  int a;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> sqrtable;
  iterator iStack_40;
  int p;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  vector<int,_std::allocator<int>_> primes;
  MOD_SQRT_SmallValues_Test *this_local;
  
  primes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)this;
  eratosthenes_sieve((vector<int,_std::allocator<int>_> *)&__range1,300);
  __end1 = std::vector<int,_std::allocator<int>_>::begin
                     ((vector<int,_std::allocator<int>_> *)&__range1);
  iStack_40 = std::vector<int,_std::allocator<int>_>::end
                        ((vector<int,_std::allocator<int>_> *)&__range1);
  while (bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffffc0), bVar1) {
    piVar2 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&__end1);
    sqrtable._M_h._M_single_bucket._4_4_ = *piVar2;
    std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::unordered_set
              ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
               local_80);
    for (local_84 = 0; local_84 < sqrtable._M_h._M_single_bucket._4_4_; local_84 = local_84 + 1) {
      local_88 = local_84 * local_84;
      std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::insert
                ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
                 local_80,&local_88);
    }
    __end2 = std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::
             begin((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
                   local_80);
    _s = (__node_type *)
         std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::end
                   ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
                    local_80);
    while (bVar1 = std::__detail::operator!=
                             (&__end2.super__Node_iterator_base<int,_false>,
                              (_Node_iterator_base<int,_false> *)&s), bVar1) {
      piVar3 = std::__detail::_Node_iterator<int,_true,_false>::operator*(&__end2);
      gtest_ar.message_.ptr_._4_4_ = *piVar3;
      sqrt(__x);
      local_dc = (int)((long)(ulong)(uint)(extraout_EAX * extraout_EAX) %
                      (long)sqrtable._M_h._M_single_bucket._4_4_);
      local_e0 = gtest_ar.message_.ptr_._4_4_ % sqrtable._M_h._M_single_bucket._4_4_;
      testing::internal::EqHelper<false>::Compare<int,int>
                ((EqHelper<false> *)local_d8,"(s*s)%p","a % p",&local_dc,&local_e0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
      if (!bVar1) {
        testing::Message::Message(&local_e8);
        message = testing::AssertionResult::failure_message((AssertionResult *)local_d8);
        testing::internal::AssertHelper::AssertHelper
                  (&local_f0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/trinerdi[P]icpc-notebook/src/kactl/number-theory/ModSqrt_test.cpp"
                   ,0xc,message);
        testing::internal::AssertHelper::operator=(&local_f0,&local_e8);
        testing::internal::AssertHelper::~AssertHelper(&local_f0);
        testing::Message::~Message(&local_e8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
      std::__detail::_Node_iterator<int,_true,_false>::operator++(&__end2);
    }
    std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::
    ~unordered_set((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
                   local_80);
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1);
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&__range1);
  return;
}

Assistant:

TEST(MOD_SQRT, SmallValues) {
    auto primes = eratosthenes_sieve(300);
    for(int p : primes) {
        unordered_set<int> sqrtable;
        rep(a,0,p) sqrtable.insert(a*a);
        for(int a : sqrtable) {
            int s = sqrt(a, p);
            EXPECT_EQ((s*s)%p, a % p);
        }
    }
}